

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateTessLevelAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  bool bVar1;
  BuiltIn BVar2;
  spv_const_context psVar3;
  DiagnosticStream *pDVar4;
  AssemblyGrammar *pAVar5;
  reference pEVar6;
  mapped_type *pmVar7;
  BuiltInsValidator *local_998;
  code *local_990;
  undefined8 local_988;
  type local_980;
  value_type local_830;
  uint32_t local_80c;
  string local_808;
  char *local_7e8;
  string local_7e0;
  DiagnosticStream local_7c0;
  uint32_t local_5e8;
  ExecutionModel local_5e4;
  uint32_t vuid_2;
  ExecutionModel execution_model;
  iterator __end3;
  iterator __begin3;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range3;
  BuiltInsValidator *local_5c0;
  code *local_5b8;
  undefined8 local_5b0;
  type local_5a8;
  value_type local_440;
  uint32_t local_41c;
  uint local_418;
  ExecutionModel local_414;
  uint32_t vuid_1;
  code *local_408;
  undefined8 local_400;
  type local_3f8;
  value_type local_290;
  uint32_t local_270;
  uint local_26c;
  undefined1 local_268 [4];
  uint32_t vuid;
  string local_248;
  char *local_228;
  DiagnosticStream local_220;
  StorageClass local_48;
  BuiltIn local_44;
  StorageClass storage_class;
  uint32_t operand;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  _storage_class = referenced_from_inst;
  referenced_from_inst_local = referenced_inst;
  referenced_inst_local = built_in_inst;
  built_in_inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  local_44 = Decoration::builtin(decoration);
  psVar3 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar3->target_env);
  if (bVar1) {
    local_48 = GetStorageClass(_storage_class);
    if (((local_48 != Max) && (local_48 != Input)) && (local_48 != Output)) {
      ValidationState_t::diag(&local_220,this->_,SPV_ERROR_INVALID_DATA,_storage_class);
      pDVar4 = DiagnosticStream::operator<<(&local_220,(char (*) [28])"Vulkan spec allows BuiltIn ")
      ;
      pAVar5 = ValidationState_t::grammar(this->_);
      local_228 = AssemblyGrammar::lookupOperandName(pAVar5,SPV_OPERAND_TYPE_BUILT_IN,local_44);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_228);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [68])0x3d2e33);
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_248,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                 referenced_from_inst_local,_storage_class,ExecutionModelMax);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_248);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [2])0x3e7969);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                ((string *)local_268,this,_storage_class);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_268);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      std::__cxx11::string::~string((string *)local_268);
      std::__cxx11::string::~string((string *)&local_248);
      DiagnosticStream::~DiagnosticStream(&local_220);
      return this_local._4_4_;
    }
    if (local_48 == Input) {
      if (this->function_id_ != 0) {
        __assert_fail("function_id_ == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                      ,0xa0b,
                      "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateTessLevelAtReference(const Decoration &, const Instruction &, const Instruction &, const Instruction &)"
                     );
      }
      BVar2 = Decoration::builtin((Decoration *)built_in_inst_local);
      local_26c = (uint)(BVar2 != BuiltInTessLevelOuter) * 4 + 0x1127;
      local_270 = Instruction::id(_storage_class);
      pmVar7 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](&this->id_to_at_reference_checks_,&local_270);
      local_408 = ValidateNotCalledWithExecutionModel;
      local_400 = 0;
      local_414 = ExecutionModelTessellationControl;
      _vuid_1 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int&,char_const(&)[149],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_3f8,(offset_in_BuiltInsValidator_to_subr *)&local_408,
                 (BuiltInsValidator **)&vuid_1,&local_26c,
                 (char (*) [149])
                 "Vulkan spec doesn\'t allow TessLevelOuter/TessLevelInner to be used for variables with Input storage class if execution model is TessellationControl."
                 ,&local_414,(Decoration *)built_in_inst_local,referenced_inst_local,_storage_class,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_290,&local_3f8)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar7,&local_290);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_290);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_unsigned_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_3f8);
    }
    if (local_48 == Output) {
      if (this->function_id_ != 0) {
        __assert_fail("function_id_ == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                      ,0xa19,
                      "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateTessLevelAtReference(const Decoration &, const Instruction &, const Instruction &, const Instruction &)"
                     );
      }
      BVar2 = Decoration::builtin((Decoration *)built_in_inst_local);
      local_418 = (uint)(BVar2 != BuiltInTessLevelOuter) * 4 + 0x1128;
      local_41c = Instruction::id(_storage_class);
      pmVar7 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](&this->id_to_at_reference_checks_,&local_41c);
      local_5b8 = ValidateNotCalledWithExecutionModel;
      local_5b0 = 0;
      __range3._4_4_ = 2;
      local_5c0 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int&,char_const(&)[153],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_5a8,(offset_in_BuiltInsValidator_to_subr *)&local_5b8,&local_5c0,&local_418,
                 (char (*) [153])
                 "Vulkan spec doesn\'t allow TessLevelOuter/TessLevelInner to be used for variables with Output storage class if execution model is TessellationEvaluation."
                 ,(ExecutionModel *)((long)&__range3 + 4),(Decoration *)built_in_inst_local,
                 referenced_inst_local,_storage_class,(_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_440,&local_5a8)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar7,&local_440);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_440);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_unsigned_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_5a8);
    }
    __end3 = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::begin(&this->execution_models_);
    _vuid_2 = std::
              set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
              ::end(&this->execution_models_);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&vuid_2), bVar1) {
      pEVar6 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end3);
      local_5e4 = *pEVar6;
      if (local_5e4 != ExecutionModelTessellationControl &&
          local_5e4 != ExecutionModelTessellationEvaluation) {
        local_5e8 = 0x112a;
        if (local_44 == BuiltInTessLevelOuter) {
          local_5e8 = 0x1126;
        }
        ValidationState_t::diag(&local_7c0,this->_,SPV_ERROR_INVALID_DATA,_storage_class);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_7e0,this->_,local_5e8,(char *)0x0);
        pDVar4 = DiagnosticStream::operator<<(&local_7c0,&local_7e0);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [28])"Vulkan spec allows BuiltIn ");
        pAVar5 = ValidationState_t::grammar(this->_);
        local_7e8 = AssemblyGrammar::lookupOperandName(pAVar5,SPV_OPERAND_TYPE_BUILT_IN,local_44);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_7e8);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [87])0x3d2638);
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  (&local_808,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                   referenced_from_inst_local,_storage_class,local_5e4);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_808);
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        std::__cxx11::string::~string((string *)&local_808);
        std::__cxx11::string::~string((string *)&local_7e0);
        DiagnosticStream::~DiagnosticStream(&local_7c0);
        return this_local._4_4_;
      }
      std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end3);
    }
  }
  if (this->function_id_ == 0) {
    local_80c = Instruction::id(_storage_class);
    pmVar7 = std::
             map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
             ::operator[](&this->id_to_at_reference_checks_,&local_80c);
    local_990 = ValidateTessLevelAtReference;
    local_988 = 0;
    local_998 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_980,(offset_in_BuiltInsValidator_to_subr *)&local_990,&local_998,
               (Decoration *)built_in_inst_local,referenced_inst_local,_storage_class,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_830,&local_980);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(pmVar7,&local_830);
    std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_830);
    std::
    _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
    ::~_Bind(&local_980);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateTessLevelAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  uint32_t operand = (uint32_t)decoration.builtin();
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input &&
        storage_class != spv::StorageClass::Output) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << "Vulkan spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                              operand)
             << " to be only used for variables with Input or Output storage "
                "class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    if (storage_class == spv::StorageClass::Input) {
      assert(function_id_ == 0);
      uint32_t vuid =
          (decoration.builtin() == spv::BuiltIn::TessLevelOuter) ? 4391 : 4395;
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, vuid,
          "Vulkan spec doesn't allow TessLevelOuter/TessLevelInner to be "
          "used "
          "for variables with Input storage class if execution model is "
          "TessellationControl.",
          spv::ExecutionModel::TessellationControl, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
    }

    if (storage_class == spv::StorageClass::Output) {
      assert(function_id_ == 0);
      uint32_t vuid =
          (decoration.builtin() == spv::BuiltIn::TessLevelOuter) ? 4392 : 4396;
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, vuid,
          "Vulkan spec doesn't allow TessLevelOuter/TessLevelInner to be "
          "used "
          "for variables with Output storage class if execution model is "
          "TessellationEvaluation.",
          spv::ExecutionModel::TessellationEvaluation, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      switch (execution_model) {
        case spv::ExecutionModel::TessellationControl:
        case spv::ExecutionModel::TessellationEvaluation: {
          // Ok.
          break;
        }

        default: {
          uint32_t vuid = (spv::BuiltIn(operand) == spv::BuiltIn::TessLevelOuter) ? 4390 : 4394;
          return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
                 << _.VkErrorID(vuid) << "Vulkan spec allows BuiltIn "
                 << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                                  operand)
                 << " to be used only with TessellationControl or "
                    "TessellationEvaluation execution models. "
                 << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                     referenced_from_inst, execution_model);
        }
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateTessLevelAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}